

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteMasterKey(WalletBatch *this,uint nID,CMasterKey *kMasterKey)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::MASTER_KEY_abi_cxx11_);
  local_50.second = nID;
  bVar1 = WriteIC<std::pair<std::__cxx11::string,unsigned_int>,wallet::CMasterKey>
                    (this,&local_50,kMasterKey,true);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteMasterKey(unsigned int nID, const CMasterKey& kMasterKey)
{
    return WriteIC(std::make_pair(DBKeys::MASTER_KEY, nID), kMasterKey, true);
}